

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmorpher.cpp
# Opt level: O0

EffectProps * __thiscall
anon_unknown.dwarf_16ca7c::VmorpherStateFactory::getDefaultProps(VmorpherStateFactory *this)

{
  EffectProps *in_RDI;
  EffectProps *props;
  
  memset(in_RDI,0,0x6c);
  (in_RDI->Chorus).Waveform = 0x3fb47ae1;
  (in_RDI->Reverb).Diffusion = 0.0;
  (in_RDI->Reverb).Gain = 1.4013e-44;
  (in_RDI->Reverb).GainHF = 0.0;
  (in_RDI->Reverb).DecayTime = 0.0;
  (in_RDI->Reverb).DecayHFRatio = 0.0;
  return in_RDI;
}

Assistant:

EffectProps VmorpherStateFactory::getDefaultProps() const noexcept
{
    EffectProps props{};
    props.Vmorpher.Rate                 = AL_VOCAL_MORPHER_DEFAULT_RATE;
    props.Vmorpher.PhonemeA             = AL_VOCAL_MORPHER_DEFAULT_PHONEMEA;
    props.Vmorpher.PhonemeB             = AL_VOCAL_MORPHER_DEFAULT_PHONEMEB;
    props.Vmorpher.PhonemeACoarseTuning = AL_VOCAL_MORPHER_DEFAULT_PHONEMEA_COARSE_TUNING;
    props.Vmorpher.PhonemeBCoarseTuning = AL_VOCAL_MORPHER_DEFAULT_PHONEMEB_COARSE_TUNING;
    props.Vmorpher.Waveform             = AL_VOCAL_MORPHER_DEFAULT_WAVEFORM;
    return props;
}